

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::IPCFrame_BindServiceReply::IPCFrame_BindServiceReply
          (IPCFrame_BindServiceReply *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__IPCFrame_BindServiceReply_003c9a00;
  this->success_ = false;
  *(undefined8 *)&this->service_id_ = 0;
  *(undefined8 *)
   ((long)&(this->methods_).
           super__Vector_base<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo,_std::allocator<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->methods_).
  super__Vector_base<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo,_std::allocator<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->methods_).
  super__Vector_base<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo,_std::allocator<perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

IPCFrame_BindServiceReply::IPCFrame_BindServiceReply() = default;